

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase211::run(TestCase211 *this)

{
  word **this_00;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  Orphan<capnp::Text> *value;
  Builder local_200;
  bool local_1e1;
  undefined1 local_1e0 [7];
  bool _kj_shouldLog;
  undefined1 local_1c8 [8];
  Builder root;
  BuilderFor<capnp::Text> local_188;
  size_t local_170;
  uint local_164;
  Fault local_160;
  Fault f;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder builder;
  TestCase211 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::Text>((Orphan<capnp::Text> *)local_120,&local_130,8);
  Orphan<capnp::Text>::get((BuilderFor<capnp::Text> *)&f,(Orphan<capnp::Text> *)local_120);
  sVar2 = Text::Builder::size((Builder *)&f);
  if (sVar2 != 8) {
    local_164 = 8;
    Orphan<capnp::Text>::get(&local_188,(Orphan<capnp::Text> *)local_120);
    local_170 = Text::Builder::size(&local_188);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xd7,FAILED,"(8u) == (orphan.get().size())","8u, orphan.get().size()",&local_164,
               &local_170);
    kj::_::Debug::Fault::fatal(&local_160);
  }
  Orphan<capnp::Text>::get
            ((BuilderFor<capnp::Text> *)&root._builder.dataSize,(Orphan<capnp::Text> *)local_120);
  pcVar3 = Text::Builder::begin((Builder *)&root._builder.dataSize);
  builtin_strncpy(pcVar3,"12345678",8);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_1c8,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::Text>>((Orphan<capnp::Text> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptTextField((Builder *)local_1c8,value);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_1e0,(Builder *)local_1c8);
  bVar1 = capnp::operator==("12345678",(Builder *)local_1e0);
  if (!bVar1) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_200,(Builder *)local_1c8);
      kj::_::Debug::log<char_const(&)[55],char_const(&)[9],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(\\\"12345678\\\") == (root.getTextField())\", \"12345678\", root.getTextField()"
                 ,(char (*) [55])"failed: expected (\"12345678\") == (root.getTextField())",
                 (char (*) [9])"12345678",&local_200);
      local_1e1 = false;
    }
  }
  Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, OrphanageText) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphan<Text>(8);
  ASSERT_EQ(8u, orphan.get().size());
  memcpy(orphan.get().begin(), "12345678", 8);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
  EXPECT_EQ("12345678", root.getTextField());
}